

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp_extract.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char **__source;
  path *this;
  bool bVar1;
  _Path<std::__cxx11::basic_string<char>_> *p_Var2;
  int iVar3;
  uint in_R8D;
  int iVar4;
  uint uVar5;
  char *args;
  undefined1 local_110 [8];
  string file_name;
  Mzp mzp;
  string archive_data;
  string path;
  allocator<char> local_31;
  
  if (argc - 4U < 0xfffffffe) {
    fprintf(_stderr,"%s infile [out_dir]\n",*argv);
    return -1;
  }
  mzp.entry_data.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&archive_data._M_string_length;
  archive_data._M_dataplus._M_p = (pointer)0x0;
  archive_data._M_string_length._0_1_ = 0;
  bVar1 = mg::fs::read_file(argv[1],(string *)
                                    &mzp.entry_data.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar1) {
    iVar3 = -1;
    goto LAB_00104689;
  }
  mzp.entry_data.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mzp.entry_data.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mzp.entry_headers.
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mzp.entry_headers.
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mzp.header.magic[0] = '\0';
  mzp.header.magic[1] = '\0';
  mzp.header.magic[2] = '\0';
  mzp.header.magic[3] = '\0';
  mzp.header.magic[4] = '\0';
  mzp.header.magic[5] = '\0';
  mzp.header.archive_entry_count = 0;
  mzp.entry_headers.
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bVar1 = mg::data::mzp_read((string *)
                             &mzp.entry_data.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (Mzp *)((long)&file_name.field_2 + 8));
  if (bVar1) {
    __source = argv + 2;
    std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
              ((path *)((long)&path.field_2 + 8),__source,auto_format);
    bVar1 = std::filesystem::exists((path *)((long)&path.field_2 + 8));
    std::filesystem::__cxx11::path::~path((path *)((long)&path.field_2 + 8));
    if (!bVar1) {
      fprintf(_stderr,"Output directory \'%s\' does not exist, exiting\n",*__source);
      goto LAB_0010467a;
    }
    this = (path *)(&path.field_2._M_allocated_capacity + 1);
    uVar5 = 0;
    iVar4 = 0;
    do {
      args = (char *)(ulong)uVar5;
      if ((char *)((long)mzp.entry_headers.
                         super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start - (long)mzp.header >> 3) <= args)
      {
        iVar3 = 0;
        break;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)this,"%s_%04u.bin",&local_31);
      mg::string::format<char*,unsigned_int>
                ((string *)local_110,(string *)this,(string *)argv[1],args,in_R8D);
      std::__cxx11::string::~string((string *)this);
      if (argc == 3) {
        std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
                  (this,__source,auto_format);
        p_Var2 = std::filesystem::__cxx11::path::append<std::__cxx11::string>
                           (this,(string *)local_110);
        std::__cxx11::string::string
                  ((string *)(archive_data.field_2._M_local_buf + 8),(string *)p_Var2);
      }
      else {
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (this,(string *)local_110,auto_format);
        std::__cxx11::string::string
                  ((string *)(archive_data.field_2._M_local_buf + 8),(string *)this);
      }
      std::filesystem::__cxx11::path::~path(this);
      std::__cxx11::string::~string((string *)local_110);
      bVar1 = mg::fs::write_file((char *)archive_data.field_2._8_8_,
                                 (string *)
                                 (mzp.entry_headers.
                                  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                 (long)args * 4));
      iVar3 = -1;
      if (bVar1) {
        fprintf(_stderr,"Wrote %s\n",archive_data.field_2._8_8_);
        iVar3 = iVar4;
      }
      std::__cxx11::string::~string((string *)(archive_data.field_2._M_local_buf + 8));
      uVar5 = uVar5 + 1;
      iVar4 = iVar3;
    } while (bVar1);
  }
  else {
    fwrite("Failed to parse archive\n",0x18,1,_stderr);
LAB_0010467a:
    iVar3 = -1;
  }
  mg::data::Mzp::~Mzp((Mzp *)((long)&file_name.field_2 + 8));
LAB_00104689:
  std::__cxx11::string::~string
            ((string *)
             &mzp.entry_data.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 2 && argc != 3) {
    fprintf(stderr, "%s infile [out_dir]\n", argv[0]);
    return -1;
  }

  // Read input file
  std::string archive_data;
  if (!mg::fs::read_file(argv[1], archive_data)) {
    return -1;
  }

  // Extract header
  mg::data::Mzp mzp;
  if (!mg::data::mzp_read(archive_data, mzp)) {
    fprintf(stderr, "Failed to parse archive\n");
    return -1;
  }

  // If we are putting output in a specific folder, check it exists
  if (!std::filesystem::exists(argv[2])) {
    fprintf(stderr, "Output directory '%s' does not exist, exiting\n", argv[2]);
    return -1;
  }

  // Helper to get output file path for entries
  auto output_path = [&](unsigned entry) -> std::string {
    std::string file_name = mg::string::format("%s_%04u.bin", argv[1], entry);
    if (argc == 3) {
      return std::filesystem::path(argv[2]).append(file_name);
    } else {
      return std::filesystem::path(file_name);
    }
  };

  // Split MZP into constituent files
  for (unsigned i = 0; i < mzp.entry_headers.size(); i++) {
    std::string path = output_path(i);
    auto &data = mzp.entry_data[i];
    if (!mg::fs::write_file(path.c_str(), data)) {
      return -1;
    }
    fprintf(stderr, "Wrote %s\n", path.c_str());
  }

  return 0;
}